

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O3

int PARMCI_GetS(void *src_ptr,int *src_stride_arr,void *dst_ptr,int *dst_stride_arr,int *count,
               int stride_levels,int proc)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = armci_check_contiguous(src_stride_arr,dst_stride_arr,count,stride_levels);
  if (iVar1 == 0) {
    iVar1 = comex_gets(src_ptr,src_stride_arr,dst_ptr,dst_stride_arr,count,stride_levels,proc,0);
    return iVar1;
  }
  if (stride_levels < 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 1;
    uVar2 = 0;
    do {
      iVar1 = iVar1 * count[uVar2];
      uVar2 = uVar2 + 1;
    } while (stride_levels + 1 != uVar2);
  }
  iVar1 = comex_get(src_ptr,dst_ptr,iVar1,proc,0);
  return iVar1;
}

Assistant:

int PARMCI_GetS(void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_get(src_ptr, dst_ptr, lcount, proc, COMEX_GROUP_WORLD);
  } else {
    iret = comex_gets(src_ptr, src_stride_arr, dst_ptr, dst_stride_arr,
        count, stride_levels, proc, COMEX_GROUP_WORLD);
  }
  return iret;
}